

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-sw.c
# Opt level: O0

void sha1_sw_write(BinarySink *bs,void *vp,size_t len)

{
  _Bool _Var1;
  sha1_sw *s;
  size_t len_local;
  void *vp_local;
  BinarySink *bs_local;
  
  s = (sha1_sw *)len;
  len_local = (size_t)vp;
  vp_local = bs;
  while (s != (sha1_sw *)0x0) {
    _Var1 = sha1_block_write((sha1_block *)&bs[-4].binarysink_,(void **)&len_local,(size_t *)&s);
    if (_Var1) {
      sha1_sw_block((uint32_t *)&bs[-5].binarysink_,(uint8_t *)&bs[-4].binarysink_);
    }
  }
  return;
}

Assistant:

static void sha1_sw_write(BinarySink *bs, const void *vp, size_t len)
{
    sha1_sw *s = BinarySink_DOWNCAST(bs, sha1_sw);

    while (len > 0)
        if (sha1_block_write(&s->blk, &vp, &len))
            sha1_sw_block(s->core, s->blk.block);
}